

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O1

char * ctemplate::ExpandIs(Template *tpl,TemplateDictionary *dict,PerExpandData *per_expand_data,
                          bool expected)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  char cVar3;
  bool bVar4;
  char *__dest;
  string outstring;
  undefined **local_58;
  string *local_50;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  if (per_expand_data == (PerExpandData *)0x0) {
    local_58 = &PTR__ExpandEmitter_00119d18;
    local_50 = &local_48;
    ctemplate::default_template_cache();
    cVar3 = ctemplate::Template::ExpandWithDataAndCache
                      ((ExpandEmitter *)tpl,(TemplateDictionaryInterface *)&local_58,
                       (PerExpandData *)dict,(TemplateCache *)0x0);
    if ((bool)cVar3 == expected) goto LAB_00112865;
    printf("ASSERT FAILED, line %d: %s\n",0xac,"expected == tpl->Expand(&outstring, dict)");
    bVar4 = Template::ExpandWithData
                      (tpl,&local_48,(TemplateDictionaryInterface *)dict,(PerExpandData *)0x0);
    if (bVar4 != expected) {
      __assert_fail("expected == tpl->Expand(&outstring, dict)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                    ,0xac,
                    "const char *ctemplate::ExpandIs(const Template *, const TemplateDictionary *, PerExpandData *, bool)"
                   );
    }
  }
  else {
    local_58 = &PTR__ExpandEmitter_00119d18;
    local_50 = &local_48;
    ctemplate::default_template_cache();
    cVar3 = ctemplate::Template::ExpandWithDataAndCache
                      ((ExpandEmitter *)tpl,(TemplateDictionaryInterface *)&local_58,
                       (PerExpandData *)dict,(TemplateCache *)per_expand_data);
    if ((bool)cVar3 == expected) {
LAB_00112865:
      __dest = (char *)operator_new__(local_48._M_string_length + 1);
      _Var2._M_p = local_48._M_dataplus._M_p;
      strcpy(__dest,local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != paVar1) {
        operator_delete(_Var2._M_p);
      }
      return __dest;
    }
    printf("ASSERT FAILED, line %d: %s\n",0xaa,
           "expected == tpl->ExpandWithData(&outstring, dict, per_expand_data)");
    bVar4 = Template::ExpandWithData
                      (tpl,&local_48,(TemplateDictionaryInterface *)dict,per_expand_data);
    if (bVar4 != expected) {
      __assert_fail("expected == tpl->ExpandWithData(&outstring, dict, per_expand_data)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                    ,0xaa,
                    "const char *ctemplate::ExpandIs(const Template *, const TemplateDictionary *, PerExpandData *, bool)"
                   );
    }
  }
  exit(1);
}

Assistant:

const char* ExpandIs(const Template* tpl, const TemplateDictionary *dict,
                     PerExpandData* per_expand_data, bool expected) {
  string outstring;
  if (per_expand_data)
    ASSERT(expected == tpl->ExpandWithData(&outstring, dict, per_expand_data));
  else
    ASSERT(expected == tpl->Expand(&outstring, dict));


  char* buf = new char[outstring.size()+1];
  strcpy(buf, outstring.c_str());
  return buf;
}